

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SharedDtor(ConvolutionLayerParams *this)

{
  bool bVar1;
  ConvolutionLayerParams *pCVar2;
  ConvolutionLayerParams *this_local;
  
  pCVar2 = internal_default_instance();
  if ((this != pCVar2) && (this->weights_ != (WeightParams *)0x0)) {
    (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pCVar2 = internal_default_instance();
  if ((this != pCVar2) && (this->bias_ != (WeightParams *)0x0)) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  bVar1 = has_ConvolutionPaddingType(this);
  if (bVar1) {
    clear_ConvolutionPaddingType(this);
  }
  return;
}

Assistant:

void ConvolutionLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete weights_;
  }
  if (this != internal_default_instance()) {
    delete bias_;
  }
  if (has_ConvolutionPaddingType()) {
    clear_ConvolutionPaddingType();
  }
}